

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O3

void __thiscall cppurses::Event_loop::run_async(Event_loop *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<int> *this_00;
  _State_baseV2 *__tmp;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __basic_future<int> local_58;
  long *local_40;
  __state_type local_38;
  
  local_38.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_38.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001646f8;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00164748;
  this_00 = (_Result<int> *)operator_new(0x18);
  std::__future_base::_Result<int>::_Result(this_00);
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  *(Event_loop **)&p_Var3[4]._M_use_count = this;
  local_58._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40 = (long *)operator_new(0x20);
  *local_40 = (long)&PTR___State_001647a0;
  local_40[1] = (long)(p_Var3 + 1);
  local_40[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/event_loop.cpp:33:43)>_>,_int>
                      ::_M_run;
  local_40[3] = 0;
  std::thread::_M_start_thread(&local_58,&local_40,0);
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  if (p_Var3[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var3[3]._vptr__Sp_counted_base =
         (_func_int **)
         local_58._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var3 + 1);
    local_38.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    std::__basic_future<int>::__basic_future(&local_58,&local_38);
    if (local_38.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var2._M_pi = local_58._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_58._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (this->fut_).super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->fut_).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->fut_).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      if (local_58._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    return;
  }
  std::terminate();
}

Assistant:

auto Event_loop::run_async() -> void
{
    fut_ = std::async(std::launch::async, [this] { return this->run(); });
}